

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDetector.cpp
# Opt level: O2

Result * ZXing::Pdf417::Detector::Detect
                   (Result *__return_storage_ptr__,BinaryBitmap *image,bool multiple,bool tryRotate)

{
  list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
  *plVar1;
  bool bVar2;
  BitMatrix *pBVar3;
  undefined **ppuVar4;
  int iVar5;
  int iVar6;
  __shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2> local_b0;
  shared_ptr<ZXing::BitMatrix> newBits;
  Result result;
  __allocator_type __a2;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  pBVar3 = BinaryBitmap::getBitMatrix(image);
  local_b0._M_ptr = pBVar3;
  local_b0._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  result.bits.super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&__a2;
  (local_b0._M_refcount._M_pi)->_M_use_count = 1;
  (local_b0._M_refcount._M_pi)->_M_weak_count = 1;
  ppuVar4 = &PTR___Sp_counted_base_0020a7c0;
  (local_b0._M_refcount._M_pi)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_base_0020a7c0;
  local_b0._M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)pBVar3;
  result.bits.super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_deleter<const_ZXing::BitMatrix_*,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/huycn[P]zxing-cpp/core/src/pdf417/PDFDetector.cpp:338:71),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_deleter<const_ZXing::BitMatrix_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_huycn[P]zxing_cpp_core_src_pdf417_PDFDetector_cpp:338:71),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&result);
  if (local_b0._M_ptr == (BitMatrix *)0x0) {
    (__return_storage_ptr__->bits).
    super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (__return_storage_ptr__->bits).
    super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->points).
    super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         (_List_node_base *)&__return_storage_ptr__->points;
    (__return_storage_ptr__->points).
    super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
    ._M_impl._M_node.super__List_node_base._M_next =
         (_List_node_base *)&__return_storage_ptr__->points;
    (__return_storage_ptr__->points).
    super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
    ._M_impl._M_node._M_size = 0;
    __return_storage_ptr__->rotation = -1;
  }
  else {
    plVar1 = &result.points;
    result.bits.super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    result.bits.super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    result.points.
    super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
    ._M_impl._M_node._M_size = 0;
    result.rotation = -1;
    iVar6 = 0x5a;
    if (tryRotate) {
      iVar6 = 0xb4;
    }
    result.points.
    super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
    result.points.
    super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
    for (iVar5 = 0; iVar6 != iVar5; iVar5 = iVar5 + 0x5a) {
      bVar2 = HasStartPattern(local_b0._M_ptr,iVar5 != 0);
      if (bVar2) {
        result.rotation = iVar5;
        if (iVar5 != 0) {
          BitMatrix::BitMatrix((BitMatrix *)&__a2,local_b0._M_ptr);
          std::make_shared<ZXing::BitMatrix,ZXing::BitMatrix>((BitMatrix *)&newBits);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48)
          ;
          BitMatrix::rotate90(newBits.
                              super___shared_ptr<ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
          std::__shared_ptr<ZXing::BitMatrix_const,(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<ZXing::BitMatrix_const,(__gnu_cxx::_Lock_policy)2> *)&local_b0,
                     (__shared_ptr<ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2> *)&newBits);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&newBits.super___shared_ptr<ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        DetectBarcode_abi_cxx11_
                  ((list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
                    *)&__a2,(Pdf417 *)local_b0._M_ptr,(BitMatrix *)(ulong)multiple,SUB81(ppuVar4,0))
        ;
        std::__cxx11::
        list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
        ::_M_move_assign(plVar1,(BitMatrix *)&__a2);
        std::__cxx11::
        _List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
        ::_M_clear((_List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
                    *)&__a2);
        std::__shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2> *)&result,
                   &local_b0);
        if (result.points.
            super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
            ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)plVar1) {
          BitMatrix::BitMatrix((BitMatrix *)&__a2,local_b0._M_ptr);
          std::make_shared<ZXing::BitMatrix,ZXing::BitMatrix>((BitMatrix *)&newBits);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48)
          ;
          BitMatrix::rotate180
                    (newBits.super___shared_ptr<ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    );
          DetectBarcode_abi_cxx11_
                    ((list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
                      *)&__a2,(Pdf417 *)
                              newBits.
                              super___shared_ptr<ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,(BitMatrix *)(ulong)multiple,SUB81(ppuVar4,0));
          std::__cxx11::
          list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
          ::_M_move_assign(plVar1,(BitMatrix *)&__a2);
          std::__cxx11::
          _List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
          ::_M_clear((_List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
                      *)&__a2);
          result.rotation = result.rotation + 0xb4;
          std::__shared_ptr<ZXing::BitMatrix_const,(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<ZXing::BitMatrix_const,(__gnu_cxx::_Lock_policy)2> *)&result,
                     (__shared_ptr<ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2> *)&newBits);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&newBits.super___shared_ptr<ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        if (result.points.
            super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
            ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)plVar1) {
          Result::Result(__return_storage_ptr__,&result);
          goto LAB_001819cb;
        }
      }
    }
    (__return_storage_ptr__->bits).
    super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (__return_storage_ptr__->bits).
    super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->points).
    super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         (_List_node_base *)&__return_storage_ptr__->points;
    (__return_storage_ptr__->points).
    super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
    ._M_impl._M_node.super__List_node_base._M_next =
         (_List_node_base *)&__return_storage_ptr__->points;
    (__return_storage_ptr__->points).
    super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
    ._M_impl._M_node._M_size = 0;
    __return_storage_ptr__->rotation = -1;
LAB_001819cb:
    Result::~Result(&result);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

Detector::Result Detector::Detect(const BinaryBitmap& image, bool multiple, bool tryRotate)
{
	// construct a 'dummy' shared pointer, just be able to pass it up the call chain in DetectorResult
	// TODO: reimplement PDF Detector
	auto binImg = std::shared_ptr<const BitMatrix>(image.getBitMatrix(), [](const BitMatrix*){});
	if (!binImg)
		return {};

	Result result;

	for (int rotate90 = 0; rotate90 <= static_cast<int>(tryRotate); ++rotate90) {
		if (!HasStartPattern(*binImg, rotate90))
			continue;

		result.rotation = 90 * rotate90;
		if (rotate90) {
			auto newBits = std::make_shared<BitMatrix>(binImg->copy());
			newBits->rotate90();
			binImg = newBits;
		}

		result.points = DetectBarcode(*binImg, multiple);
		result.bits = binImg;
		if (result.points.empty()) {
			auto newBits = std::make_shared<BitMatrix>(binImg->copy());
			newBits->rotate180();
			result.points = DetectBarcode(*newBits, multiple);
			result.rotation += 180;
			result.bits = newBits;
		}

		if (!result.points.empty())
			return result;
	}

	return {};
}